

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O2

int __thiscall NmakeMakefileGenerator::init(NmakeMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  int iVar7;
  QList<ProString> *pQVar8;
  QList<ProString> *this_00;
  ProStringList *pPVar9;
  QArrayDataPointer<ProString> *pQVar10;
  char *str;
  ProString *pPVar11;
  EVP_PKEY_CTX *ctx_00;
  QMakeProject *pQVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_2d0;
  QArrayDataPointer<char16_t> local_2b8 [2];
  ProString local_288;
  QArrayDataPointer<char16_t> local_258;
  QFileInfo targetFileInfo;
  ProKey local_238;
  ProString local_208;
  ProString local_1d8;
  ProString targetBase;
  ProString major_minor;
  undefined1 local_128 [96];
  ProString version;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_128,"TEMPLATE");
  QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
  bVar6 = ProString::operator==(&version,"app");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  if (bVar6) {
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    str = "QMAKE_APP_FLAG";
LAB_001b1c57:
    ProKey::ProKey((ProKey *)&version,str);
    pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
              super_QList<ProString>;
    ProString::ProString((ProString *)local_128,"1");
    QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
LAB_001b1ca7:
    Win32MakefileGenerator::processVars(&this->super_Win32MakefileGenerator);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"RES_FILE");
    pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
              super_QList<ProString>;
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"LIBS");
    this_00 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128)->
               super_QList<ProString>;
    QList<ProString>::append(this_00,pQVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"DEF_FILE");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version);
    lVar2 = (pPVar9->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (lVar2 != 0) {
      major_minor.m_string.d.size = -0x5555555555555556;
      major_minor.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      major_minor.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"DEF_FILE");
      QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      ProString::toQString(&targetBase.m_string,&version);
      MakefileGenerator::fileFixify
                (&major_minor.m_string,(MakefileGenerator *)this,&targetBase.m_string,
                 (FileFixifyTypes)0x0,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_LFLAGS");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      QString::QString(&local_1d8.m_string,"/DEF:");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_208,this,&major_minor);
      QStringBuilder<QString,_QString>::QStringBuilder
                ((QStringBuilder<QString,_QString> *)&targetBase,&local_1d8.m_string,
                 &local_208.m_string);
      ProString::ProString<QString,QString>
                ((ProString *)local_128,(QStringBuilder<QString,_QString> *)&targetBase);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QStringBuilder<QString,_QString>::~QStringBuilder
                ((QStringBuilder<QString,_QString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&major_minor);
    }
    major_minor.m_file = -0x55555556;
    major_minor._36_4_ = 0xaaaaaaaa;
    major_minor.m_hash = 0xaaaaaaaaaaaaaaaa;
    major_minor.m_string.d.size = -0x5555555555555556;
    major_minor.m_offset = -0x55555556;
    major_minor.m_length = -0x55555556;
    major_minor.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    major_minor.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"VERSION_PE_HEADER");
    QMakeEvaluator::first(&major_minor,&pQVar12->super_QMakeEvaluator,(ProKey *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (major_minor.m_length == 0) {
      version.m_file = -0x55555556;
      version._36_4_ = 0xaaaaaaaa;
      version.m_hash = 0xaaaaaaaaaaaaaaaa;
      version.m_string.d.size = -0x5555555555555556;
      version.m_offset = -0x55555556;
      version.m_length = -0x55555556;
      version.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      version.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"VERSION");
      QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      if (version.m_length != 0) {
        iVar7 = ProString::indexOf(&version,".",0,CaseSensitive);
        iVar7 = ProString::indexOf(&version,".",iVar7 + 1,CaseSensitive);
        ProString::left((ProString *)local_128,&version,iVar7);
        ProString::operator=(&major_minor,(ProString *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if (major_minor.m_length != 0) goto LAB_001b1ff6;
    }
    else {
LAB_001b1ff6:
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_LFLAGS");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      targetBase.m_string.d.d = (Data *)anon_var_dwarf_2e37c9;
      targetBase.m_string.d.ptr = (char16_t *)&major_minor;
      ProString::ProString<char_const(&)[10],ProString&>
                ((ProString *)local_128,
                 (QStringBuilder<const_char_(&)[10],_ProString_&> *)&targetBase);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"QMAKE_LINK_O_FLAG");
    pPVar11 = &version;
    bVar6 = QMakeProject::isEmpty(pQVar12,(ProKey *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (bVar6) {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_LINK_O_FLAG");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      ProString::ProString((ProString *)local_128,"/OUT:");
      pPVar11 = (ProString *)local_128;
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    MakefileGenerator::init((MakefileGenerator *)this,(EVP_PKEY_CTX *)pPVar11);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"PRECOMPILED_HEADER");
    QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
    ProString::toQString(&targetBase.m_string,&version);
    pDVar4 = (this->precompH).d.d;
    pcVar5 = (this->precompH).d.ptr;
    (this->precompH).d.d = targetBase.m_string.d.d;
    (this->precompH).d.ptr = targetBase.m_string.d.ptr;
    qVar3 = (this->precompH).d.size;
    (this->precompH).d.size = targetBase.m_string.d.size;
    targetBase.m_string.d.d = pDVar4;
    targetBase.m_string.d.ptr = pcVar5;
    targetBase.m_string.d.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    if ((this->precompH).d.size == 0) {
      this->usePCH = false;
LAB_001b2239:
      this->usePCHC = false;
    }
    else {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&version.m_string,"precompile_header");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
      this->usePCH = bVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if ((this->precompH).d.size == 0) goto LAB_001b2239;
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&version.m_string,"precompile_header_c");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
      this->usePCHC = bVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    if (this->usePCH == true) {
      ProKey::ProKey((ProKey *)&local_1d8,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(local_2b8,this,&local_1d8);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_238,"TARGET");
      QMakeEvaluator::first(&local_208,&pQVar12->super_QMakeEvaluator,&local_238);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&targetBase,(QString *)local_2b8,&local_208);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128,
                 (QStringBuilder<QString,_ProString> *)&targetBase);
      local_128._72_8_ = "_pch";
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>::QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]> *)&version,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]> *)local_128)
      ;
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
      ::convertTo<QString>
                (&local_288.m_string,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
                  *)&version);
      pDVar4 = (this->precompObj).d.d;
      pcVar5 = (this->precompObj).d.ptr;
      (this->precompObj).d.d = local_288.m_string.d.d;
      (this->precompObj).d.ptr = local_288.m_string.d.ptr;
      qVar3 = (this->precompObj).d.size;
      (this->precompObj).d.size = local_288.m_string.d.size;
      local_288.m_string.d.d = pDVar4;
      local_288.m_string.d.ptr = pcVar5;
      local_288.m_string.d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      ProKey::ProKey((ProKey *)&targetBase,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_288,this,&targetBase);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_208,"TARGET");
      QMakeEvaluator::first(&local_1d8,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_208);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128,&local_288.m_string,&local_1d8);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version,
                 (QStringBuilder<QString,_ProString> *)local_128);
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]>::convertTo<QString>
                ((QString *)&local_238,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]> *)&version);
      pDVar4 = (this->precompPch).d.d;
      pcVar5 = (this->precompPch).d.ptr;
      (this->precompPch).d.d = local_238.super_ProString.m_string.d.d;
      (this->precompPch).d.ptr = local_238.super_ProString.m_string.d.ptr;
      qVar3 = (this->precompPch).d.size;
      (this->precompPch).d.size = local_238.super_ProString.m_string.d.size;
      local_238.super_ProString.m_string.d.d = pDVar4;
      local_238.super_ProString.m_string.d.ptr = pcVar5;
      local_238.super_ProString.m_string.d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&version.m_string,"clang_cl");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if (!bVar6) {
        ProString::ProString(&version,&this->precompObj);
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)local_128,"OBJECTS");
        pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128)->
                  super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar8,&version);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      }
      ProString::ProString(&version,&this->precompPch);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"QMAKE_CLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128)->
                super_QList<ProString>;
      QList<ProString>::emplaceBack<ProString>(pQVar8,&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      ProString::ProString(&version,&this->precompObj);
      ProStringList::ProStringList((ProStringList *)&targetBase,&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"PRECOMPILED_OBJECT");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      ProString::ProString(&version,&this->precompPch);
      ProStringList::ProStringList((ProStringList *)&targetBase,&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"PRECOMPILED_PCH");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    if (this->usePCHC == true) {
      ProKey::ProKey((ProKey *)&local_1d8,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(local_2b8,this,&local_1d8);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_238,"TARGET");
      QMakeEvaluator::first(&local_208,&pQVar12->super_QMakeEvaluator,&local_238);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&targetBase,(QString *)local_2b8,&local_208);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128,
                 (QStringBuilder<QString,_ProString> *)&targetBase);
      local_128._72_8_ = "_pch_c";
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>::QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]> *)&version,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]> *)local_128)
      ;
      QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
      ::convertTo<QString>
                (&local_288.m_string,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
                  *)&version);
      pDVar4 = (this->precompObjC).d.d;
      pcVar5 = (this->precompObjC).d.ptr;
      (this->precompObjC).d.d = local_288.m_string.d.d;
      (this->precompObjC).d.ptr = local_288.m_string.d.ptr;
      qVar3 = (this->precompObjC).d.size;
      (this->precompObjC).d.size = local_288.m_string.d.size;
      local_288.m_string.d.d = pDVar4;
      local_288.m_string.d.ptr = pcVar5;
      local_288.m_string.d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      ProKey::ProKey((ProKey *)&targetBase,"PRECOMPILED_DIR");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_288,this,&targetBase);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_208,"TARGET");
      QMakeEvaluator::first(&local_1d8,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_208);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128,&local_288.m_string,&local_1d8);
      QStringBuilder<QString,_ProString>::QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version,
                 (QStringBuilder<QString,_ProString> *)local_128);
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]>::convertTo<QString>
                ((QString *)&local_238,
                 (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]> *)&version)
      ;
      pDVar4 = (this->precompPchC).d.d;
      pcVar5 = (this->precompPchC).d.ptr;
      (this->precompPchC).d.d = local_238.super_ProString.m_string.d.d;
      (this->precompPchC).d.ptr = local_238.super_ProString.m_string.d.ptr;
      qVar3 = (this->precompPchC).d.size;
      (this->precompPchC).d.size = local_238.super_ProString.m_string.d.size;
      local_238.super_ProString.m_string.d.d = pDVar4;
      local_238.super_ProString.m_string.d.ptr = pcVar5;
      local_238.super_ProString.m_string.d.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)&version);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&version.m_string,"clang_cl");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if (!bVar6) {
        ProString::ProString(&version,&this->precompObjC);
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)local_128,"OBJECTS");
        pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128)->
                  super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar8,&version);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      }
      ProString::ProString(&version,&this->precompPchC);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"QMAKE_CLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128)->
                super_QList<ProString>;
      QList<ProString>::emplaceBack<ProString>(pQVar8,&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      ProString::ProString(&version,&this->precompObjC);
      ProStringList::ProStringList((ProStringList *)&targetBase,&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"PRECOMPILED_OBJECT_C");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      ProString::ProString(&version,&this->precompPchC);
      ProStringList::ProStringList((ProStringList *)&targetBase,&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_128,"PRECOMPILED_PCH_C");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
      QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&targetBase);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    _targetFileInfo = 0xaaaaaaaaaaaaaaaa;
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_1d8,"DESTDIR");
    QMakeEvaluator::first(&targetBase,&pQVar12->super_QMakeEvaluator,(ProKey *)&local_1d8);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_238,"TARGET");
    QMakeEvaluator::first(&local_208,&pQVar12->super_QMakeEvaluator,&local_238);
    QStringBuilder<ProString,_ProString>::QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)local_128,&targetBase,&local_208);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_2b8,"TARGET_EXT");
    QMakeEvaluator::first(&local_288,&pQVar12->super_QMakeEvaluator,(ProKey *)local_2b8);
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&version,
               (QStringBuilder<ProString,_ProString> *)local_128,&local_288);
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::convertTo<QString>
              ((QString *)&local_258,
               (QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&version);
    QFileInfo::QFileInfo(&targetFileInfo,(QString *)&local_258);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
    QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_2b8);
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
    targetBase.m_file = -0x55555556;
    targetBase._36_4_ = 0xaaaaaaaa;
    targetBase.m_hash = 0xaaaaaaaaaaaaaaaa;
    targetBase.m_string.d.size = -0x5555555555555556;
    targetBase.m_offset = -0x55555556;
    targetBase.m_length = -0x55555556;
    targetBase.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    targetBase.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QFileInfo::path();
    local_128._16_8_ = local_1d8.m_string.d.size;
    local_128._8_8_ = local_1d8.m_string.d.ptr;
    local_128._0_8_ = local_1d8.m_string.d.d;
    local_1d8.m_string.d.d = (Data *)0x0;
    local_1d8.m_string.d.ptr = (char16_t *)0x0;
    local_1d8.m_string.d.size = 0;
    local_128[0x18] = '/';
    QFileInfo::completeBaseName();
    QStringBuilder<QStringBuilder<QString,_char>,_QString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_char>,_QString> *)&version,
               (QStringBuilder<QString,_char> *)local_128,&local_208.m_string);
    ProString::ProString<QStringBuilder<QString,char>,QString>
              (&targetBase,(QStringBuilder<QStringBuilder<QString,_char>,_QString> *)&version);
    QStringBuilder<QStringBuilder<QString,_char>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_char>,_QString> *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"TEMPLATE");
    QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
    bVar6 = ProString::operator==(&version,"lib");
    if (bVar6) {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&local_1d8.m_string,"shared");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&local_1d8.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      if (bVar6) {
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&version,"QMAKE_CLEAN");
        pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                  super_QList<ProString>;
        local_1d8.m_string.d.ptr = L".exp";
        local_1d8.m_string.d.d = (Data *)&targetBase;
        ProString::ProString<ProString_const&,char_const(&)[5]>
                  ((ProString *)local_128,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_1d8);
        QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&version,"QMAKE_DISTCLEAN");
        pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                  super_QList<ProString>;
        local_1d8.m_string.d.ptr = L".lib";
        local_1d8.m_string.d.d = (Data *)&targetBase;
        ProString::ProString<ProString_const&,char_const(&)[5]>
                  ((ProString *)local_128,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_1d8);
        QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    }
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString(&version.m_string,"debug_info");
    bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (bVar6) {
      local_288.m_string.d.size = 0;
      local_288.m_string.d.d = (Data *)0x0;
      local_288.m_string.d.ptr = (char16_t *)0x0;
      local_2b8[0].size = -0x5555555555555556;
      local_2b8[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_2b8[0].ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      version.m_string.d.ptr = L".pdb";
      version.m_string.d.d = (Data *)&targetBase;
      QStringBuilder<const_ProString_&,_const_char_(&)[5]>::convertTo<QString>
                ((QString *)local_2b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString(&version.m_string,"staticlib");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if (bVar6) {
        QString::operator=(&local_288.m_string,(QString *)local_2b8);
      }
      else {
        ProKey::ProKey((ProKey *)&local_1d8,"OBJECTS_DIR");
        (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
          _vptr_QMakeSourceFileInfo[0x16])(&local_2d0,this,&local_1d8);
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey(&local_238,"TARGET");
        QMakeEvaluator::first(&local_208,&pQVar12->super_QMakeEvaluator,&local_238);
        QStringBuilder<QString,_ProString>::QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)local_128,(QString *)&local_2d0,&local_208)
        ;
        QStringBuilder<QString,_ProString>::QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)&version,
                   (QStringBuilder<QString,_ProString> *)local_128);
        QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]>::convertTo<QString>
                  ((QString *)&local_258,
                   (QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]> *)&version
                  );
        qVar3 = local_288.m_string.d.size;
        pcVar5 = local_288.m_string.d.ptr;
        pDVar4 = local_288.m_string.d.d;
        local_288.m_string.d.d = local_258.d;
        local_288.m_string.d.ptr = local_258.ptr;
        local_258.d = pDVar4;
        local_258.ptr = pcVar5;
        local_288.m_string.d.size = local_258.size;
        local_258.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        QStringBuilder<QString,_ProString>::~QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)&version);
        QStringBuilder<QString,_ProString>::~QStringBuilder
                  ((QStringBuilder<QString,_ProString> *)local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      }
      local_1d8.m_string.d.size = -0x5555555555555556;
      local_1d8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_1d8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])(&local_1d8,this,&local_288);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_CFLAGS");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      local_208.m_string.d.d = (Data *)0x21fda1;
      local_208.m_string.d.ptr = (char16_t *)&local_1d8;
      ProString::ProString<char_const(&)[4],QString&>
                ((ProString *)local_128,(QStringBuilder<const_char_(&)[4],_QString_&> *)&local_208);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_CXXFLAGS");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      local_208.m_string.d.d = (Data *)0x21fda1;
      local_208.m_string.d.ptr = (char16_t *)&local_1d8;
      ProString::ProString<char_const(&)[4],QString&>
                ((ProString *)local_128,(QStringBuilder<const_char_(&)[4],_QString_&> *)&local_208);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_CLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      ProString::ProString((ProString *)local_128,&local_288.m_string);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_DISTCLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      ProString::ProString((ProString *)local_128,(QString *)local_2b8);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
    }
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString(&version.m_string,"debug");
    bVar6 = QMakeProject::isActiveConfig(pQVar12,&version.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (bVar6) {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_CLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      local_1d8.m_string.d.ptr = L".ilk";
      local_1d8.m_string.d.d = (Data *)&targetBase;
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_128,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_1d8);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&version,"QMAKE_CLEAN");
      pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                super_QList<ProString>;
      local_1d8.m_string.d.ptr = L".idb";
      local_1d8.m_string.d.d = (Data *)&targetBase;
      ProString::ProString<ProString_const&,char_const(&)[5]>
                ((ProString *)local_128,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)&local_1d8);
      QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"QMAKE_APP_FLAG");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version);
    if ((pPVar9->super_QList<ProString>).d.size == 0) {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      QString::QString((QString *)local_128,"dll");
      bVar6 = QMakeProject::isActiveConfig(pQVar12,(QString *)local_128,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
      if (bVar6) {
        pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&version,"DEFINES");
        pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version)->
                  super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
        bVar6 = ProStringList::contains((ProStringList *)pQVar8,"_WINDLL",CaseSensitive);
        if (!bVar6) {
          ProString::ProString(&version,"_WINDLL");
          QList<ProString>::emplaceBack<ProString>(pQVar8,&version);
          goto LAB_001b3545;
        }
      }
    }
    else {
LAB_001b3545:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&targetBase);
    QFileInfo::~QFileInfo(&targetFileInfo);
    pPVar11 = &major_minor;
  }
  else {
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"TEMPLATE");
    QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
    bVar6 = ProString::operator==(&version,"lib");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    if (bVar6) {
      pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      str = "QMAKE_LIB_FLAG";
      goto LAB_001b1c57;
    }
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_128,"TEMPLATE");
    QMakeEvaluator::first(&version,&pQVar12->super_QMakeEvaluator,(ProKey *)local_128);
    ctx_00 = (EVP_PKEY_CTX *)0x2221aa;
    bVar6 = ProString::operator==(&version,"subdirs");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    if (!bVar6) goto LAB_001b1ca7;
    MakefileGenerator::init((MakefileGenerator *)this,ctx_00);
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&version,"MAKEFILE");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)&version);
    lVar2 = (pPVar9->super_QList<ProString>).d.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&version);
    if (lVar2 != 0) goto LAB_001b3606;
    pQVar12 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    pPVar11 = &version;
    ProKey::ProKey((ProKey *)pPVar11,"MAKEFILE");
    pQVar8 = &QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)pPVar11)->
              super_QList<ProString>;
    ProString::ProString((ProString *)local_128,"Makefile");
    QList<ProString>::emplaceBack<ProString>(pQVar8,(ProString *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar11);
LAB_001b3606:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void NmakeMakefileGenerator::init()
{
    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->values("MAKEFILE").isEmpty())
            project->values("MAKEFILE").append("Makefile");
        return;
    }

    processVars();

    project->values("LIBS") += project->values("RES_FILE");

    if (!project->values("DEF_FILE").isEmpty()) {
        QString defFileName = fileFixify(project->first("DEF_FILE").toQString());
        project->values("QMAKE_LFLAGS").append(QString("/DEF:") + escapeFilePath(defFileName));
    }

    // set /VERSION for EXE/DLL header
    ProString major_minor = project->first("VERSION_PE_HEADER");
    if (major_minor.isEmpty()) {
        ProString version = project->first("VERSION");
        if (!version.isEmpty()) {
            int firstDot = version.indexOf(".");
            int secondDot = version.indexOf(".", firstDot + 1);
            major_minor = version.left(secondDot);
        }
    }
    if (!major_minor.isEmpty())
        project->values("QMAKE_LFLAGS").append("/VERSION:" + major_minor);

    if (project->isEmpty("QMAKE_LINK_O_FLAG"))
        project->values("QMAKE_LINK_O_FLAG").append("/OUT:");

    // Base class init!
    MakefileGenerator::init();

    // Setup PCH variables
    precompH = project->first("PRECOMPILED_HEADER").toQString();
    usePCH = !precompH.isEmpty() && project->isActiveConfig("precompile_header");
    usePCHC = !precompH.isEmpty() && project->isActiveConfig("precompile_header_c");
    if (usePCH) {
        // Created files
        precompObj = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch" + Option::obj_ext;
        precompPch = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch.pch";
        // Add linking of precompObj (required for whole precompiled classes)
        // ### For clang_cl we currently let inline methods be generated in the normal objects,
        // since the PCH object is buggy (as of clang 8.0.0)
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObj;
        // Add pch file to cleanup
        project->values("QMAKE_CLEAN") += precompPch;
        // Return to variable pool
        project->values("PRECOMPILED_OBJECT") = ProStringList(precompObj);
        project->values("PRECOMPILED_PCH")    = ProStringList(precompPch);
    }
    if (usePCHC) {
        precompObjC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c" + Option::obj_ext;
        precompPchC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c.pch";
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObjC;
        project->values("QMAKE_CLEAN") += precompPchC;
        project->values("PRECOMPILED_OBJECT_C") = ProStringList(precompObjC);
        project->values("PRECOMPILED_PCH_C")    = ProStringList(precompPchC);
    }

    const QFileInfo targetFileInfo(project->first("DESTDIR") + project->first("TARGET")
            + project->first("TARGET_EXT"));
    const ProString targetBase = targetFileInfo.path() + '/' + targetFileInfo.completeBaseName();
    if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("shared")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".exp");
        project->values("QMAKE_DISTCLEAN").append(targetBase + ".lib");
    }
    if (project->isActiveConfig("debug_info")) {
        QString pdbfile;
        QString distPdbFile = targetBase + ".pdb";
        if (project->isActiveConfig("staticlib")) {
            // For static libraries, the compiler's pdb file and the dist pdb file are the same.
            pdbfile = distPdbFile;
        } else {
            // Use $${TARGET}.vc.pdb in the OBJECTS_DIR for the compiler and
            // $${TARGET}.pdb (the default) for the linker.
            pdbfile = var("OBJECTS_DIR") + project->first("TARGET") + ".vc.pdb";
        }
        QString escapedPdbFile = escapeFilePath(pdbfile);
        project->values("QMAKE_CFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CXXFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CLEAN").append(pdbfile);
        project->values("QMAKE_DISTCLEAN").append(distPdbFile);
    }
    if (project->isActiveConfig("debug")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".ilk");
        project->values("QMAKE_CLEAN").append(targetBase + ".idb");
    }

    if (project->values("QMAKE_APP_FLAG").isEmpty() && project->isActiveConfig("dll")) {
        ProStringList &defines = project->values("DEFINES");
        if (!defines.contains("_WINDLL"))
            defines.append("_WINDLL");
    }
}